

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonCodec.cc
# Opt level: O0

size_t __thiscall
avro::parsing::JsonDecoder<avro::parsing::SimpleParser<avro::parsing::JsonDecoderHandler>_>::skipMap
          (JsonDecoder<avro::parsing::SimpleParser<avro::parsing::JsonDecoderHandler>_> *this)

{
  JsonDecoder<avro::parsing::SimpleParser<avro::parsing::JsonDecoderHandler>_> *in_RDI;
  JsonDecoder<avro::parsing::SimpleParser<avro::parsing::JsonDecoderHandler>_> *unaff_retaddr;
  Kind in_stack_00000284;
  SimpleParser<avro::parsing::JsonDecoderHandler> *in_stack_00000288;
  Token in_stack_ffffffffffffffec;
  
  SimpleParser<avro::parsing::JsonDecoderHandler>::advance(in_stack_00000288,in_stack_00000284);
  SimpleParser<avro::parsing::JsonDecoderHandler>::pop
            ((SimpleParser<avro::parsing::JsonDecoderHandler> *)0x29ed75);
  SimpleParser<avro::parsing::JsonDecoderHandler>::advance(in_stack_00000288,in_stack_00000284);
  expect(in_RDI,in_stack_ffffffffffffffec);
  skipComposite(unaff_retaddr);
  return 0;
}

Assistant:

size_t JsonDecoder<P>::skipMap()
{
    parser_.advance(Symbol::sMapStart);
    parser_.pop();
    parser_.advance(Symbol::sMapEnd);
    expect(JsonParser::tkObjectStart);
    skipComposite();
    return 0;
}